

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::stringstream_parser<float>(string *text,float *value)

{
  stringstream in;
  byte abStack_180 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)text,_S_out|_S_in);
  std::istream::_M_extract<float>((float *)&in);
  if ((abStack_180[*(long *)(_in + -0x18)] & 5) != 0) {
    throw_or_mimic<cxxopts::argument_incorrect_type>(text);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&in);
  return;
}

Assistant:

void stringstream_parser(const std::string& text, T& value)
    {
      std::stringstream in(text);
      in >> value;
      if (!in) {
        throw_or_mimic<argument_incorrect_type>(text);
      }
    }